

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_backward_Test::TestBody
          (IntrusiveListIteratorTest_crbegin_crend_backward_Test *this)

{
  TestObject *pTVar1;
  undefined8 local_94;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_70
  ;
  TestObjectList *local_60;
  undefined8 local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  local_50.current.list_ = &(this->super_IntrusiveListIteratorTest).list_;
  local_38 = 0;
  pTVar1 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_94 = 0x200000001;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_8c = 3;
  local_50.current.node_ = pTVar1;
  local_40 = local_50.current.list_;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_88,&local_94);
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)&local_88,(vector<int,_std::allocator<int>_> *)pTVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_88);
  local_70.current.list_ = (this->super_IntrusiveListIteratorTest).clist_;
  local_58 = 0;
  pTVar1 = (local_70.current.list_)->first_;
  local_94 = 0x200000001;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_8c = 3;
  local_70.current.node_ = pTVar1;
  local_60 = local_70.current.list_;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_88,&local_94,&local_88);
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_60,&local_70,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)&local_88,(vector<int,_std::allocator<int>_> *)pTVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_88);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_backward) {
  TestBackward(list_.crbegin(), list_.crend(), {1, 2, 3});
  TestBackward(clist_.crbegin(), clist_.crend(), {1, 2, 3});
}